

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall Printer_prettyPrintRandom_Test::TestBody(Printer_prettyPrintRandom_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  AssertHelper aAStack_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  AssertionResult gtest_ar;
  string equation5;
  ModelPtr model;
  ComponentPtr component5;
  PrinterPtr printer;
  
  libcellml::Printer::create();
  libcellml::Model::create();
  peVar1 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation5,"model",(allocator<char> *)&local_90);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&equation5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation5,"component",(allocator<char> *)&local_90);
  libcellml::Component::create((string *)&component5);
  std::__cxx11::string::~string((string *)&equation5);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation5,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\"><apply>          <eq/><apply><diff/><bvar><ci>   t\n\n\t\t</ci></bvar>\n\n<ci>X</ci></apply><apply><minus/><apply><times/><ci>     alpha_X</ci>             \n<apply><minus/>\n\n\n<cn cellml:units=\"dimensionless\">1</cn><ci>X     </ci></apply></apply><apply><times/><ci>beta_X</ci><ci>X</ci></apply>\n\n\n</apply></apply></math>"
             ,(allocator<char> *)&local_90);
  libcellml::Component::setMath
            ((string *)
             component5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_90,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"PRETTY_MODEL_STRING","printer->printModel(model)",
             &PRETTY_MODEL_STRING_abi_cxx11_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x3b1,pcVar2);
    testing::internal::AssertHelper::operator=(aAStack_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(aAStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&equation5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Printer, prettyPrintRandom)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component5 = libcellml::Component::create("component");
    model->addComponent(component5);
    const std::string equation5 =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\"><apply>          "
        "<eq/><apply><diff/><bvar><ci>   t\n\n\t\t</ci></bvar>\n\n<ci>X</ci></apply>"
        "<apply><minus/><apply><times/><ci>     alpha_X</ci>             \n<apply><minus/>\n\n\n"
        "<cn cellml:units=\"dimensionless\">1</cn><ci>X     </ci></apply></apply><apply><times/>"
        "<ci>beta_X</ci><ci>X</ci></apply>\n\n\n</apply></apply></math>";
    component5->setMath(equation5);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}